

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O1

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
SearchBase::findLinkToSubtoken
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          SearchBase *this,string *htmlPage,string_view subtoken,string *capsulationBegin,
          string *capsulationEnd)

{
  bool bVar1;
  long *plVar2;
  size_type __pos;
  size_type sVar3;
  size_type *psVar4;
  long lVar5;
  char cVar6;
  string_view strv;
  size_type *local_88;
  string tokenWithCapsulationbegin;
  string_view token_element;
  undefined1 local_48 [8];
  string_view link;
  
  tokenWithCapsulationbegin.field_2._8_8_ = &token_element._M_str;
  link._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&tokenWithCapsulationbegin.field_2 + 8),subtoken._M_str,
             subtoken._M_str + subtoken._M_len);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)((long)&tokenWithCapsulationbegin.field_2 + 8),0,(char *)0x0,
                              (ulong)(capsulationBegin->_M_dataplus)._M_p);
  local_88 = &tokenWithCapsulationbegin._M_string_length;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    tokenWithCapsulationbegin._M_string_length = *psVar4;
    tokenWithCapsulationbegin.field_2._M_allocated_capacity = plVar2[3];
  }
  else {
    tokenWithCapsulationbegin._M_string_length = *psVar4;
    local_88 = (size_type *)*plVar2;
  }
  tokenWithCapsulationbegin._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((char **)tokenWithCapsulationbegin.field_2._8_8_ != &token_element._M_str) {
    operator_delete((void *)tokenWithCapsulationbegin.field_2._8_8_,
                    (ulong)(token_element._M_str + 1));
  }
  __pos = std::__cxx11::string::find((char *)htmlPage,(ulong)local_88,0);
  cVar6 = link._M_str[0x10];
  do {
    if (__pos == 0xffffffffffffffff) {
      link._M_str[0x10] = '\0';
      goto LAB_001a7adc;
    }
    lVar5 = capsulationBegin->_M_string_length + __pos;
    token_element._M_len = (size_t)((htmlPage->_M_dataplus)._M_p + lVar5);
    tokenWithCapsulationbegin.field_2._8_8_ = htmlPage->_M_string_length - lVar5;
    bVar1 = false;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&tokenWithCapsulationbegin.field_2 + 8),
                       (capsulationEnd->_M_dataplus)._M_p,0,capsulationEnd->_M_string_length);
    if (sVar3 == 0xffffffffffffffff) {
      cVar6 = '\0';
    }
    else {
      strv._M_str = (char *)token_element._M_len;
      strv._M_len = sVar3;
      tokenWithCapsulationbegin.field_2._8_8_ = sVar3;
      bVar1 = isSubtoken(this,strv,subtoken);
      if (bVar1) {
        link._M_len = (size_t)(htmlPage->_M_dataplus)._M_p;
        local_48 = (undefined1  [8])htmlPage->_M_string_length;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_48,"<a href=\""
                           ,__pos,9);
        if (sVar3 == 0xffffffffffffffff) {
          cVar6 = '\0';
        }
        else {
          link._M_len = link._M_len + sVar3 + 9;
          local_48 = (undefined1  [8])((long)local_48 - (sVar3 + 9));
          cVar6 = '\0';
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_48,"\"",0,1);
          if (sVar3 != 0xffffffffffffffff) {
            *(size_type *)link._M_str = sVar3;
            *(size_t *)(link._M_str + 8) = link._M_len;
            cVar6 = '\x01';
            local_48 = (undefined1  [8])sVar3;
          }
        }
        bVar1 = false;
      }
      else {
        __pos = std::__cxx11::string::find
                          ((char *)htmlPage,(ulong)local_88,
                           (ulong)(tokenWithCapsulationbegin._M_dataplus._M_p + __pos));
        bVar1 = true;
      }
    }
  } while (bVar1);
  link._M_str[0x10] = cVar6;
LAB_001a7adc:
  if (local_88 != &tokenWithCapsulationbegin._M_string_length) {
    operator_delete(local_88,tokenWithCapsulationbegin._M_string_length + 1);
  }
  return (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)link._M_str;
}

Assistant:

std::optional<std::string_view> findLinkToSubtoken(const std::string& htmlPage, std::string_view subtoken, const std::string& capsulationBegin, const std::string& capsulationEnd) const {
		const std::string_view link_token_begin = "<a href=\"";
		const std::string_view link_token_end = "\"";

		const std::string tokenWithCapsulationbegin = capsulationBegin + std::string(subtoken);

		size_t capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin);
		while (capsulationBegin_pos != std::string::npos) {
			std::string_view token_element = std::string_view(htmlPage);
			token_element.remove_prefix(capsulationBegin_pos + capsulationBegin.length());

			const size_t capsulationEnd_pos = token_element.find(capsulationEnd);
			if (capsulationEnd_pos == std::string::npos) {
				return {};
			}
			token_element.remove_suffix(token_element.length() - capsulationEnd_pos);

			if (isSubtoken(token_element, subtoken)) {
				std::string_view link = std::string_view(htmlPage);
				const size_t link_token_begin_pos = link.rfind(link_token_begin, capsulationBegin_pos);
				if (link_token_begin_pos == std::string::npos) {
					return {};
				}
				link.remove_prefix(link_token_begin_pos + link_token_begin.length());


				const size_t link_token_end_pos = link.find(link_token_end);
				if (link_token_end_pos == std::string::npos) {
					return {};
				}
				link.remove_suffix(link.length() - link_token_end_pos);

				return link;
			}

			capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin, capsulationBegin_pos + tokenWithCapsulationbegin.length());
		}
		return {};
	}